

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O2

void __thiscall chrono::ChFseqNode::ArchiveOUT(ChFseqNode *this,ChArchiveOut *marchive)

{
  ChNameValue<bool> local_120;
  ChNameValue<bool> local_108;
  ChNameValue<bool> local_f0;
  ChNameValue<double> local_d8;
  ChNameValue<double> local_c0;
  ChNameValue<double> local_a8;
  ChNameValue<double> local_90;
  ChNameValue<double> local_78;
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChFseqNode>(marchive);
  local_30._name = "fx";
  local_30._flags = '\0';
  local_30._value = &this->fx;
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->duration;
  local_48._name = "duration";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->weight;
  local_60._name = "weight";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  local_78._value = &this->t_start;
  local_78._name = "t_start";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_78);
  local_90._value = &this->t_end;
  local_90._name = "t_end";
  local_90._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_90);
  local_a8._value = &this->Iy;
  local_a8._name = "Iy";
  local_a8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_a8);
  local_c0._value = &this->Iydt;
  local_c0._name = "Iydt";
  local_c0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_c0);
  local_d8._value = &this->Iydtdt;
  local_d8._name = "Iydtdt";
  local_d8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_d8);
  local_f0._value = &this->y_cont;
  local_f0._name = "y_cont";
  local_f0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_f0);
  local_108._value = &this->ydt_cont;
  local_108._name = "ydt_cont";
  local_108._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_108);
  local_120._value = &this->ydtdt_cont;
  local_120._name = "ydtdt_cont";
  local_120._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_120);
  return;
}

Assistant:

void ChFseqNode::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFseqNode>();

    // serialize all member data:
    marchive << CHNVP(fx);
    marchive << CHNVP(duration);
    marchive << CHNVP(weight);
    marchive << CHNVP(t_start);
    marchive << CHNVP(t_end);
    marchive << CHNVP(Iy);
    marchive << CHNVP(Iydt);
    marchive << CHNVP(Iydtdt);
    marchive << CHNVP(y_cont);
    marchive << CHNVP(ydt_cont);
    marchive << CHNVP(ydtdt_cont);
}